

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

string * __thiscall
ruckig::join<std::array<double,3ul>>
          (string *__return_storage_ptr__,ruckig *this,array<double,_3UL> *array,bool high_precision
          )

{
  size_t i;
  long lVar1;
  ostringstream ss;
  long local_1a8;
  undefined8 local_1a0 [46];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  lVar1 = 0;
  do {
    if (lVar1 != 0) {
      if (lVar1 == 3) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        return __return_storage_ptr__;
      }
      std::operator<<((ostream *)&local_1a8,", ");
    }
    if ((char)array != '\0') {
      *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 0x10;
    }
    std::ostream::_M_insert<double>(*(double *)(this + lVar1 * 8));
    lVar1 = lVar1 + 1;
  } while( true );
}

Assistant:

inline std::string join(const Vector& array, bool high_precision = false) {
    std::ostringstream ss;
    for (size_t i = 0; i < array.size(); ++i) {
        if (i) ss << ", ";
        if (high_precision) ss << std::setprecision(16);
        ss << array[i];
    }
    return ss.str();
}